

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O0

DWORD SuperFastHash(char *data,size_t len)

{
  uint uVar1;
  ulong uVar2;
  size_t rem;
  DWORD tmp;
  DWORD hash;
  size_t len_local;
  char *data_local;
  
  rem._4_4_ = 0;
  if ((len == 0) || (data == (char *)0x0)) {
    data_local._4_4_ = 0;
  }
  else {
    uVar2 = len & 3;
    len_local = (size_t)data;
    for (_tmp = len >> 2; _tmp != 0; _tmp = _tmp - 1) {
      uVar1 = (uint)*(byte *)(len_local + 1) * 0x100 + (uint)*(byte *)len_local + rem._4_4_;
      uVar1 = uVar1 * 0x10000 ^
              ((uint)*(byte *)(len_local + 3) * 0x100 + (uint)*(byte *)(len_local + 2)) * 0x800 ^
              uVar1;
      len_local = len_local + 4;
      rem._4_4_ = (uVar1 >> 0xb) + uVar1;
    }
    if (uVar2 == 1) {
      uVar1 = ((int)*(char *)len_local + rem._4_4_) * 0x400 ^ (int)*(char *)len_local + rem._4_4_;
      rem._4_4_ = (uVar1 >> 1) + uVar1;
    }
    else if (uVar2 == 2) {
      uVar1 = (uint)*(byte *)(len_local + 1) * 0x100 + (uint)*(byte *)len_local + rem._4_4_;
      uVar1 = uVar1 * 0x800 ^ uVar1;
      rem._4_4_ = (uVar1 >> 0x11) + uVar1;
    }
    else if (uVar2 == 3) {
      uVar1 = (uint)*(byte *)(len_local + 1) * 0x100 + (uint)*(byte *)len_local + rem._4_4_;
      uVar1 = (int)*(char *)(len_local + 2) << 0x12 ^ uVar1 * 0x10000 ^ uVar1;
      rem._4_4_ = (uVar1 >> 0xb) + uVar1;
    }
    uVar1 = rem._4_4_ << 3 ^ rem._4_4_;
    uVar1 = (uVar1 >> 5) + uVar1;
    uVar1 = uVar1 * 0x10 ^ uVar1;
    uVar1 = (uVar1 >> 0x11) + uVar1;
    uVar1 = uVar1 * 0x2000000 ^ uVar1;
    data_local._4_4_ = (uVar1 >> 6) + uVar1;
  }
  return data_local._4_4_;
}

Assistant:

DWORD SuperFastHash (const char *data, size_t len)
{
	DWORD hash = 0, tmp;
	size_t rem;

	if (len == 0 || data == NULL) return 0;

	rem = len & 3;
	len >>= 2;

	/* Main loop */
	for (;len > 0; len--)
	{
		hash  += get16bits (data);
		tmp    = (get16bits (data+2) << 11) ^ hash;
		hash   = (hash << 16) ^ tmp;
		data  += 2*sizeof (WORD);
		hash  += hash >> 11;
	}

	/* Handle end cases */
	switch (rem)
	{
		case 3:	hash += get16bits (data);
				hash ^= hash << 16;
				hash ^= data[sizeof (WORD)] << 18;
				hash += hash >> 11;
				break;
		case 2:	hash += get16bits (data);
				hash ^= hash << 11;
				hash += hash >> 17;
				break;
		case 1: hash += *data;
				hash ^= hash << 10;
				hash += hash >> 1;
	}

	/* Force "avalanching" of final 127 bits */
	hash ^= hash << 3;
	hash += hash >> 5;
	hash ^= hash << 4;
	hash += hash >> 17;
	hash ^= hash << 25;
	hash += hash >> 6;

	return hash;
}